

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O3

exp_double __thiscall
ising::square::transfer_matrix::product_D<std::vector<double,std::allocator<double>>>
          (transfer_matrix *this,double beta,vector<double,_std::allocator<double>_> *inter_x,
          vector<double,_std::allocator<double>_> *field,vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  pointer paVar7;
  int s;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double extraout_XMM0_Qa;
  ulong in_XMM0_Qb;
  exp_double eVar16;
  vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_> weight;
  double local_b8;
  exp_number<double> local_98;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  ulong uStack_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_> local_60;
  double local_48;
  ulong uStack_40;
  
  uVar10 = (ulong)((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar6 = 1;
  uVar9 = (uint)uVar10;
  uVar2 = 1 << ((byte)uVar10 & 0x1f);
  local_78 = beta;
  uStack_70 = in_XMM0_Qb;
  local_68 = v;
  std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::vector
            (&local_60,(long)(int)uVar9,(allocator_type *)&local_98);
  if ((int)uVar9 < 1) {
    *(undefined8 *)this = 0;
    *(undefined4 *)(this + 8) = 1;
    local_b8 = 0.0;
  }
  else {
    local_48 = -local_78;
    uStack_40 = uStack_70 ^ 0x8000000000000000;
    uVar11 = (ulong)(uVar9 & 0x7fffffff);
    iVar6 = 1;
    local_b8 = 0.0;
    lVar12 = 0;
    do {
      local_88 = ABS(*(double *)
                      ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar12) * local_78);
      uStack_80 = 0;
      standards::exp_number<double>::exp_number(&local_98,local_88);
      iVar6 = iVar6 * local_98.sign_;
      local_b8 = (double)(~-(ulong)(ABS((local_b8 + local_98.log_) / local_98.log_) < 1e-10) &
                         (ulong)(local_b8 + local_98.log_));
      dVar14 = exp(*(double *)
                    ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar12) * local_78 - local_88);
      *(double *)
       ((long)(local_60.
               super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->elems + lVar12 * 2) = dVar14;
      dVar14 = exp(*(double *)
                    ((long)(inter_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar12) * local_48 - local_88);
      *(double *)
       ((long)(local_60.
               super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->elems + lVar12 * 2 + 8) = dVar14;
      lVar12 = lVar12 + 8;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    *(double *)this = local_b8;
    *(int *)(this + 8) = iVar6;
    bVar13 = true;
    if (uVar9 == 0x1f) goto LAB_00101dd5;
  }
  pdVar1 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 1;
  if (1 < (int)uVar2) {
    uVar11 = (ulong)uVar2;
  }
  uVar8 = 0;
  do {
    dVar14 = pdVar1[uVar8];
    if (0 < (int)uVar9) {
      uVar5 = 0;
      paVar7 = local_60.
               super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar3 = (byte)uVar5;
        bVar13 = (uVar10 & 0xffffffff) - 1 == uVar5;
        uVar5 = uVar5 + 1;
        bVar4 = (byte)uVar5;
        if (bVar13) {
          bVar4 = 0;
        }
        dVar14 = dVar14 * paVar7->elems
                          [((uint)uVar8 >> (bVar4 & 0x1f) ^ (uint)uVar8 >> (bVar3 & 0x1f)) & 1];
        paVar7 = paVar7 + 1;
      } while ((uVar10 & 0xffffffff) != uVar5);
    }
    pdVar1[uVar8] = dVar14;
    uVar8 = uVar8 + 1;
  } while (uVar8 != uVar11);
  bVar13 = false;
LAB_00101dd5:
  if ((field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    dVar14 = local_b8;
    if (0 < (int)uVar9) {
      local_48 = -local_78;
      uStack_40 = uStack_70 ^ 0x8000000000000000;
      uVar10 = (ulong)(uVar9 & 0x7fffffff);
      lVar12 = 0;
      do {
        local_88 = ABS(*(double *)
                        ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar12) * local_78);
        uStack_80 = 0;
        standards::exp_number<double>::exp_number(&local_98,local_88);
        iVar6 = iVar6 * local_98.sign_;
        dVar14 = (double)(~-(ulong)(ABS((dVar14 + local_98.log_) / local_98.log_) < 1e-10) &
                         (ulong)(dVar14 + local_98.log_));
        dVar15 = exp(*(double *)
                      ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar12) * local_78 - local_88);
        *(double *)
         ((long)(local_60.
                 super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->elems + lVar12 * 2) = dVar15;
        dVar15 = exp(*(double *)
                      ((long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar12) * local_48 - local_88);
        *(double *)
         ((long)(local_60.
                 super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->elems + lVar12 * 2 + 8) = dVar15;
        lVar12 = lVar12 + 8;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    *(double *)this = dVar14;
    *(int *)(this + 8) = iVar6;
    if (!bVar13) {
      pdVar1 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 1;
      if (1 < (int)uVar2) {
        uVar10 = (ulong)uVar2;
      }
      uVar11 = 0;
      do {
        dVar14 = pdVar1[uVar11];
        if (0 < (int)uVar9) {
          uVar8 = 0;
          paVar7 = local_60.
                   super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            dVar14 = dVar14 * paVar7->elems[((uint)uVar11 >> ((uint)uVar8 & 0x1f) & 1) != 0];
            uVar8 = uVar8 + 1;
            paVar7 = paVar7 + 1;
          } while ((uVar9 & 0x7fffffff) != uVar8);
        }
        pdVar1[uVar11] = dVar14;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
  }
  if (local_60.
      super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    dVar14 = extraout_XMM0_Qa;
  }
  eVar16._8_8_ = this;
  eVar16.log_ = dVar14;
  return eVar16;
}

Assistant:

static exp_double product_D(double beta, std::vector<double> const& inter_x,
                                   std::vector<double> const& field, VEC& v) {
    int width = inter_x.size();
    int dim = 1 << width;
    exp_double normal = 1;
    std::vector<boost::array<double, 2> > weight(width);
    for (int b = 0; b < width; ++b) {
      double offset = std::abs(beta * inter_x[b]);
      normal *= standards::exp_number<double>(offset);
      weight[b][0] = std::exp(beta * inter_x[b] - offset);
      weight[b][1] = std::exp(-beta * inter_x[b] - offset);
    }
    for (int c = 0; c < dim; ++c) {
      double elem = v[c];
      for (int b = 0; b < width; ++b) {
        int s0 = b;
        int s1 = (b+1) % width;
        elem *= weight[b][((c >> s0) & 1) ^ ((c >> s1) & 1)];
      }
      v[c] = elem;
    }
    if (field.size()) {
      for (int s = 0; s < width; ++s) {
        double offset = std::abs(beta * field[s]);
        normal *= standards::exp_number<double>(offset);
        weight[s][0] = std::exp(beta * field[s] - offset);
        weight[s][1] = std::exp(-beta * field[s] - offset);
      }
      for (int c = 0; c < dim; ++c) {
        double elem = v[c];
        for (int s = 0; s < width; ++s) elem *= weight[s][((c >> s) & 1)];
        v[c] = elem;
      }
    }
    return normal;
  }